

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O3

void recompute_shading_normals(mesh *mesh)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  float *pfVar7;
  long lVar8;
  undefined4 *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pvVar4 = mesh->attrs[1].data;
  pvVar5 = mesh->attrs[2].data;
  lVar8 = 4 - (ulong)(mesh->type == TRI_MESH);
  if (mesh->vertex_count == 0) {
    uVar12 = 0;
  }
  else {
    puVar9 = (undefined4 *)((long)pvVar4 + 8);
    uVar11 = 0;
    do {
      *(undefined8 *)(puVar9 + -2) = 0;
      *puVar9 = 0;
      uVar11 = uVar11 + 1;
      uVar12 = mesh->vertex_count;
      puVar9 = puVar9 + 3;
    } while (uVar11 < uVar12);
  }
  if (mesh->primitive_count != 0) {
    lVar10 = 0;
    uVar12 = 0;
    do {
      uVar2 = *(undefined8 *)((long)pvVar5 + uVar12 * 0xc);
      fVar1 = *(float *)((long)pvVar5 + uVar12 * 0xc + 8);
      lVar13 = lVar10;
      lVar14 = lVar8;
      do {
        lVar6 = *(long *)((long)mesh->indices + lVar13);
        uVar3 = *(undefined8 *)((long)pvVar4 + lVar6 * 0xc);
        fVar15 = *(float *)((long)pvVar4 + lVar6 * 0xc + 8);
        *(ulong *)((long)pvVar4 + lVar6 * 0xc) =
             CONCAT44((float)((ulong)uVar3 >> 0x20) + (float)((ulong)uVar2 >> 0x20),
                      (float)uVar3 + (float)uVar2);
        *(float *)((long)pvVar4 + lVar6 * 0xc + 8) = fVar15 + fVar1;
        lVar13 = lVar13 + 8;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      uVar12 = uVar12 + 1;
      lVar10 = lVar10 + lVar8 * 8;
    } while (uVar12 < mesh->primitive_count);
    uVar12 = mesh->vertex_count;
  }
  if (uVar12 != 0) {
    pfVar7 = (float *)((long)pvVar4 + 8);
    uVar12 = 0;
    do {
      fVar1 = *pfVar7;
      fVar15 = (float)*(undefined8 *)(pfVar7 + -2);
      fVar16 = (float)((ulong)*(undefined8 *)(pfVar7 + -2) >> 0x20);
      fVar17 = 1.0 / SQRT(fVar15 * fVar15 + fVar16 * fVar16 + fVar1 * fVar1);
      *(ulong *)(pfVar7 + -2) = CONCAT44(fVar17 * fVar16,fVar17 * fVar15);
      *pfVar7 = fVar1 * fVar17;
      uVar12 = uVar12 + 1;
      pfVar7 = pfVar7 + 3;
    } while (uVar12 < mesh->vertex_count);
  }
  return;
}

Assistant:

void recompute_shading_normals(struct mesh* mesh) {
    const struct vec3* geometry_normals = mesh->attrs[ATTR_GEOMETRY_NORMAL].data;
    struct vec3* normals = mesh->attrs[ATTR_SHADING_NORMAL].data;
    size_t index_stride = mesh->type == TRI_MESH ? 3 : 4;
    for (size_t i = 0; i < mesh->vertex_count; ++i)
        normals[i] = const_vec3(0);
    for (size_t i = 0; i < mesh->primitive_count; i++) {
        const struct vec3 geometry_normal = geometry_normals[i];
        for (size_t j = 0; j < index_stride; ++j) {
            size_t k = mesh->indices[i * index_stride + j];
            normals[k] = add_vec3(normals[k], geometry_normal);
        }
    }
    for (size_t i = 0; i < mesh->vertex_count; ++i)
        normals[i] = normalize_vec3(normals[i]);
}